

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnFunctionNamesCount(BinaryReaderIR *this,Index count)

{
  bool bVar1;
  
  bVar1 = (ulong)((long)(this->module_->funcs).
                        super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->module_->funcs).
                        super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) < (ulong)count;
  if (bVar1) {
    PrintError(this,"expected function name count (%u) <= function count (%zd)",count);
  }
  return (Result)(uint)bVar1;
}

Assistant:

Result BinaryReaderIR::OnFunctionNamesCount(Index count) {
  if (count > module_->funcs.size()) {
    PrintError("expected function name count (%" PRIindex
               ") <= function count (%" PRIzd ")",
               count, module_->funcs.size());
    return Result::Error;
  }
  return Result::Ok;
}